

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_logger.c
# Opt level: O2

void pcp_logger(pcp_loglvl_e log_level,char *fmt,...)

{
  uint uVar1;
  char in_AL;
  int iVar2;
  char *pcVar3;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((log_level <= pcp_log_level) &&
     (local_d8 = in_RDX, local_d0 = in_RCX, local_c8 = in_R8, local_c0 = in_R9,
     pcVar3 = (char *)malloc(0x100), pcVar3 != (char *)0x0)) {
    __maxlen = 0x100;
    do {
      __s = pcVar3;
      local_f8 = local_e8;
      local_108 = 0x3000000010;
      local_100 = &stack0x00000008;
      iVar2 = vsnprintf(__s,__maxlen,fmt,&local_108);
      if (-1 < iVar2 && iVar2 < (int)__maxlen) {
        if (logger != (external_logger)0x0) {
          (*logger)(log_level,__s);
        }
        break;
      }
      uVar1 = (int)__maxlen * 2;
      if (-1 < iVar2) {
        uVar1 = iVar2 + 1;
      }
      __maxlen = (size_t)uVar1;
      pcVar3 = (char *)realloc(__s,__maxlen);
    } while (pcVar3 != (char *)0x0);
    free(__s);
  }
  return;
}

Assistant:

void pcp_logger(pcp_loglvl_e log_level, const char *fmt, ...) {
    int n;
    int size = 256; /* Guess we need no more than 256 bytes. */
    char *p, *np;
    va_list ap;

    if (log_level > pcp_log_level) {
        return;
    }

    if (!(p = (char *)malloc(size))) {
        return; // LCOV_EXCL_LINE
    }

    while (1) {

        /* Try to print in the allocated space. */

        va_start(ap, fmt);
        n = vsnprintf(p, size, fmt, ap);
        va_end(ap);

        /* If that worked, return the string. */

        if (n > -1 && n < size) {
            break;
        }

        /* Else try again with more space. */

        if (n > -1)       /* glibc 2.1 */
            size = n + 1; /* precisely what is needed */
        else
            /* glibc 2.0 */
            size *= 2; /* twice the old size */ // LCOV_EXCL_LINE

        if (!(np = (char *)realloc(p, size))) {
            free(p); // LCOV_EXCL_LINE
            return;  // LCOV_EXCL_LINE
        }
        p = np;
    }

    if (logger)
        (*logger)(log_level, p);

    free(p);
    return;
}